

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O2

void Prs_ManSkipSpaces(Prs_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_RSI;
  
  do {
    iVar1 = Prs_ManIsSpace(p);
    pcVar2 = p->pCur;
    if (iVar1 == 0) {
      if (*pcVar2 != '\\') {
        if (*pcVar2 == '#') {
          Prs_ManSkipToChar(p,(char)in_RSI);
        }
        iVar1 = Prs_ManIsSpace(p);
        if (iVar1 == 0) {
          return;
        }
        __assert_fail("!Prs_ManIsSpace(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadBlif.c"
                      ,0x84,"void Prs_ManSkipSpaces(Prs_Man_t *)");
      }
      Prs_ManSkipToChar(p,(char)in_RSI);
      pcVar2 = p->pCur;
    }
    p->pCur = pcVar2 + 1;
  } while( true );
}

Assistant:

static inline void Prs_ManSkipSpaces( Prs_Man_t * p )
{
    while ( 1 )
    {
        while ( Prs_ManIsSpace(p) )
            Prs_ManSkip(p);
        if ( Prs_ManIsChar(p, '\\') )
        {
            Prs_ManSkipToChar( p, '\n' );
            Prs_ManSkip(p);
            continue;
        }
        if ( Prs_ManIsChar(p, '#') )  
            Prs_ManSkipToChar( p, '\n' );
        break;
    }
    assert( !Prs_ManIsSpace(p) );
}